

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::PyiGenerator::PrintImports(PyiGenerator *this)

{
  Printer *pPVar1;
  ushort *puVar2;
  bool bVar3;
  FileDescriptor *pFVar4;
  Descriptor *pDVar5;
  EnumDescriptor *pEVar6;
  char *pcVar7;
  char *extraout_RDX;
  ImportModules *import_modules_00;
  byte bVar8;
  int i;
  int iVar9;
  FileDescriptor *in_RSI;
  int j;
  int iVar10;
  string_view filename;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view filename_00;
  ImportModules import_modules;
  bool has_importlib;
  string module_name;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_aliases;
  PyiGenerator *this_00;
  
  seen_aliases.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  seen_aliases.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  seen_aliases.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  has_importlib = false;
  iVar9 = 0;
  do {
    pFVar4 = this->file_;
    if (pFVar4->dependency_count_ <= iVar9) {
      import_modules.has_callable = false;
      import_modules.has_well_known_type = false;
      import_modules.has_repeated = false;
      import_modules.has_iterable = false;
      import_modules.has_messages = false;
      import_modules.has_enums = false;
      import_modules.has_extendable = false;
      import_modules.has_mapping = false;
      import_modules.has_optional = false;
      import_modules.has_union = false;
      iVar9 = pFVar4->message_type_count_;
      if (0 < iVar9) {
        import_modules.has_repeated = false;
        import_modules.has_iterable = false;
        import_modules.has_messages = true;
        import_modules.has_enums = false;
        import_modules.has_extendable = false;
        import_modules.has_mapping = false;
        import_modules.has_optional = false;
        import_modules.has_union = false;
      }
      if (0 < pFVar4->enum_type_count_) {
        import_modules.has_enums = true;
        import_modules.has_extendable = false;
        import_modules.has_mapping = false;
        import_modules.has_optional = false;
        import_modules.has_union = false;
      }
      if ((this->opensource_runtime_ == false) && (0 < pFVar4->service_count_)) {
        import_modules.has_callable = true;
        import_modules.has_well_known_type = false;
        import_modules.has_optional = true;
        import_modules.has_union = true;
      }
      for (iVar10 = 0; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        pDVar5 = FileDescriptor::message_type(pFVar4,iVar10);
        in_RSI = (FileDescriptor *)&import_modules;
        CheckImportModules((python *)pDVar5,(Descriptor *)&import_modules,import_modules_00);
        pFVar4 = this->file_;
        iVar9 = pFVar4->message_type_count_;
      }
      if (import_modules.has_repeated != false) {
        pPVar1 = this->printer_;
        InternalPackage_abi_cxx11_(&module_name,(PyiGenerator *)in_RSI);
        in_RSI = (FileDescriptor *)0x39;
        text._M_str = "from $internal_package$ import containers as _containers\n";
        text._M_len = 0x39;
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,text,(char (*) [17])"internal_package",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      if (import_modules.has_enums == true) {
        pPVar1 = this->printer_;
        InternalPackage_abi_cxx11_(&module_name,(PyiGenerator *)in_RSI);
        in_RSI = (FileDescriptor *)0x47;
        text_00._M_str = "from $internal_package$ import enum_type_wrapper as _enum_type_wrapper\n";
        text_00._M_len = 0x47;
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,text_00,(char (*) [17])"internal_package",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      if (import_modules.has_extendable == true) {
        pPVar1 = this->printer_;
        InternalPackage_abi_cxx11_(&module_name,(PyiGenerator *)in_RSI);
        in_RSI = (FileDescriptor *)0x41;
        text_01._M_str = "from $internal_package$ import python_message as _python_message\n";
        text_01._M_len = 0x41;
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,text_01,(char (*) [17])"internal_package",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      if (import_modules.has_well_known_type == true) {
        pPVar1 = this->printer_;
        InternalPackage_abi_cxx11_(&module_name,(PyiGenerator *)in_RSI);
        in_RSI = (FileDescriptor *)0x45;
        text_02._M_str = "from $internal_package$ import well_known_types as _well_known_types\n";
        text_02._M_len = 0x45;
        io::Printer::Print<char[17],std::__cxx11::string>
                  (pPVar1,text_02,(char (*) [17])"internal_package",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      pPVar1 = this->printer_;
      PublicPackage_abi_cxx11_(&module_name,(PyiGenerator *)in_RSI);
      pcVar7 = "public_package";
      this_00 = (PyiGenerator *)0x37;
      text_03._M_str = "from $public_package$ import descriptor as _descriptor\n";
      text_03._M_len = 0x37;
      io::Printer::Print<char[15],std::__cxx11::string>
                (pPVar1,text_03,(char (*) [15])"public_package",&module_name);
      std::__cxx11::string::~string((string *)&module_name);
      if (import_modules.has_messages == true) {
        pPVar1 = this->printer_;
        PublicPackage_abi_cxx11_(&module_name,this_00);
        pcVar7 = "public_package";
        this_00 = (PyiGenerator *)0x31;
        text_04._M_str = "from $public_package$ import message as _message\n";
        text_04._M_len = 0x31;
        io::Printer::Print<char[15],std::__cxx11::string>
                  (pPVar1,text_04,(char (*) [15])"public_package",&module_name);
        std::__cxx11::string::~string((string *)&module_name);
      }
      if (this->opensource_runtime_ == true) {
        bVar3 = HasGenericServices(this->file_);
        if (bVar3) {
          pPVar1 = this->printer_;
          PublicPackage_abi_cxx11_(&module_name,this_00);
          pcVar7 = "public_package";
          text_05._M_str = "from $public_package$ import service as _service\n";
          text_05._M_len = 0x31;
          io::Printer::Print<char[15],std::__cxx11::string>
                    (pPVar1,text_05,(char (*) [15])"public_package",&module_name);
          std::__cxx11::string::~string((string *)&module_name);
        }
      }
      else if (0 < this->file_->service_count_) {
        text_06._M_str =
             "from google3.net.rpc.python import proto_python_api_2_stub as _proto_python_api_2_stub\nfrom google3.net.rpc.python import pywraprpc as _pywraprpc\nfrom google3.net.rpc.python import rpcserver as _rpcserver\n"
        ;
        text_06._M_len = 0xcd;
        io::Printer::Print<>(this->printer_,text_06);
      }
      bVar3 = import_modules.has_iterable;
      if ((import_modules.has_iterable != false) || (import_modules.has_mapping == true)) {
        text_07._M_str = "from collections.abc import";
        text_07._M_len = 0x1b;
        io::Printer::Print<>(this->printer_,text_07);
        if (bVar3 == false) {
          bVar8 = import_modules.has_mapping;
        }
        else {
          text_08._M_str = " Iterable as _Iterable";
          text_08._M_len = 0x16;
          io::Printer::Print<>(this->printer_,text_08);
          bVar8 = import_modules.has_mapping;
          if (import_modules.has_mapping == true) {
            text_09._M_str = ",";
            text_09._M_len = 1;
            io::Printer::Print<>(this->printer_,text_09);
          }
        }
        if ((bVar8 & 1) != 0) {
          text_10._M_str = " Mapping as _Mapping";
          text_10._M_len = 0x14;
          io::Printer::Print<>(this->printer_,text_10);
        }
        text_11._M_str = "\n";
        text_11._M_len = 1;
        io::Printer::Print<>(this->printer_,text_11);
      }
      text_12._M_str = "from typing import ";
      text_12._M_len = 0x13;
      io::Printer::Print<>(this->printer_,text_12);
      if ((this->opensource_runtime_ == false) && (0 < this->file_->service_count_)) {
        text_13._M_str = "Any as _Any, ";
        text_13._M_len = 0xd;
        io::Printer::Print<>(this->printer_,text_13);
      }
      if (import_modules.has_callable == true) {
        text_14._M_str = "Callable as _Callable, ";
        text_14._M_len = 0x17;
        io::Printer::Print<>(this->printer_,text_14);
      }
      text_15._M_str = "ClassVar as _ClassVar";
      text_15._M_len = 0x15;
      io::Printer::Print<>(this->printer_,text_15);
      if (import_modules.has_optional == true) {
        text_16._M_str = ", Optional as _Optional";
        text_16._M_len = 0x17;
        io::Printer::Print<>(this->printer_,text_16);
      }
      if (import_modules.has_union == true) {
        text_17._M_str = ", Union as _Union";
        text_17._M_len = 0x11;
        io::Printer::Print<>(this->printer_,text_17);
      }
      text_18._M_str = "\n";
      text_18._M_len = 1;
      io::Printer::Print<>(this->printer_,text_18);
      for (iVar9 = 0; iVar9 < this->file_->public_dependency_count_; iVar9 = iVar9 + 1) {
        pFVar4 = FileDescriptor::public_dependency(this->file_,iVar9);
        filename_00._M_str = pcVar7;
        filename_00._M_len = (size_t)(pFVar4->name_->_M_dataplus)._M_p;
        StrippedModuleName_abi_cxx11_
                  (&module_name,(python *)pFVar4->name_->_M_string_length,filename_00);
        for (iVar10 = 0; iVar10 < pFVar4->message_type_count_; iVar10 = iVar10 + 1) {
          pPVar1 = this->printer_;
          pDVar5 = FileDescriptor::message_type(pFVar4,iVar10);
          puVar2 = (ushort *)(pDVar5->all_names_).payload_;
          local_68._M_len = (size_t)*puVar2;
          local_68._M_str = (char *)((long)puVar2 + ~local_68._M_len);
          pcVar7 = "module";
          text_19._M_str = "from $module$ import $message_class$ as $message_class$\n";
          text_19._M_len = 0x38;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[14],std::basic_string_view<char,std::char_traits<char>>>
                    (pPVar1,text_19,(char (*) [7])0x48d4c3,&module_name,(char (*) [14])0x526d12,
                     &local_68);
        }
        for (iVar10 = 0; iVar10 < pFVar4->enum_type_count_; iVar10 = iVar10 + 1) {
          pPVar1 = this->printer_;
          pEVar6 = FileDescriptor::enum_type(pFVar4,iVar10);
          puVar2 = (ushort *)(pEVar6->all_names_).payload_;
          local_68._M_len = (size_t)*puVar2;
          local_68._M_str = (char *)((long)puVar2 + ~local_68._M_len);
          pcVar7 = "module";
          text_20._M_str = "from $module$ import $enum_class$ as $enum_class$\n";
          text_20._M_len = 0x32;
          io::Printer::
          Print<char[7],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                    (pPVar1,text_20,(char (*) [7])0x48d4c3,&module_name,(char (*) [11])0x56435f,
                     &local_68);
        }
        std::__cxx11::string::~string((string *)&module_name);
      }
      text_21._M_str = "\n";
      text_21._M_len = 1;
      io::Printer::Print<>(this->printer_,text_21);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~raw_hash_set(&seen_aliases.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
      return;
    }
    pFVar4 = FileDescriptor::dependency(pFVar4,iVar9);
    if (this->strip_nonfunctional_codegen_ == true) {
      in_RSI = (FileDescriptor *)(pFVar4->name_->_M_dataplus)._M_p;
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)in_RSI;
      bVar3 = IsKnownFeatureProto((compiler *)pFVar4->name_->_M_string_length,filename);
      if (!bVar3) goto LAB_001a2456;
    }
    else {
LAB_001a2456:
      in_RSI = pFVar4;
      PrintImportForDescriptor(this,pFVar4,&seen_aliases,&has_importlib);
      for (iVar10 = 0; iVar10 < pFVar4->public_dependency_count_; iVar10 = iVar10 + 1) {
        in_RSI = FileDescriptor::public_dependency(pFVar4,iVar10);
        PrintImportForDescriptor(this,in_RSI,&seen_aliases,&has_importlib);
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void PyiGenerator::PrintImports() const {
  // Prints imported dependent _pb2 files.
  absl::flat_hash_set<std::string> seen_aliases;
  bool has_importlib = false;
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const FileDescriptor* dep = file_->dependency(i);
    if (strip_nonfunctional_codegen_ && IsKnownFeatureProto(dep->name())) {
      continue;
    }
    PrintImportForDescriptor(*dep, &seen_aliases, &has_importlib);
    for (int j = 0; j < dep->public_dependency_count(); ++j) {
      PrintImportForDescriptor(*dep->public_dependency(j), &seen_aliases,
                               &has_importlib);
    }
  }

  // Checks what modules should be imported.
  ImportModules import_modules;
  if (file_->message_type_count() > 0) {
    import_modules.has_messages = true;
  }
  if (file_->enum_type_count() > 0) {
    import_modules.has_enums = true;
  }
  if (!opensource_runtime_ && file_->service_count() > 0) {
    import_modules.has_callable = true;
    import_modules.has_optional = true;
    import_modules.has_union = true;
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    CheckImportModules(file_->message_type(i), &import_modules);
  }

  // Prints modules (e.g. _containers, _messages, typing) that are
  // required in the proto file.
  if (import_modules.has_repeated) {
    printer_->Print(
        "from $internal_package$ import containers as _containers\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_enums) {
    printer_->Print(
        "from $internal_package$ import enum_type_wrapper as "
        "_enum_type_wrapper\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_extendable) {
    printer_->Print(
        "from $internal_package$ import python_message as _python_message\n",
        "internal_package", InternalPackage());
  }
  if (import_modules.has_well_known_type) {
    printer_->Print(
        "from $internal_package$ import well_known_types as "
        "_well_known_types\n",
        "internal_package", InternalPackage());
  }
  printer_->Print("from $public_package$ import descriptor as _descriptor\n",
                  "public_package", PublicPackage());
  if (import_modules.has_messages) {
    printer_->Print("from $public_package$ import message as _message\n",
                    "public_package", PublicPackage());
  }
  if (opensource_runtime_) {
    if (HasGenericServices(file_)) {
      printer_->Print("from $public_package$ import service as _service\n",
                      "public_package", PublicPackage());
    }
  } else {
    if (file_->service_count() > 0) {
      printer_->Print(
          "from google3.net.rpc.python import proto_python_api_2_stub as "
          "_proto_python_api_2_stub\n"
          "from google3.net.rpc.python import pywraprpc as _pywraprpc\n"
          "from google3.net.rpc.python import rpcserver as _rpcserver\n");
    }
  }
  if (import_modules.has_iterable || import_modules.has_mapping) {
    printer_->Print("from collections.abc import");
    if (import_modules.has_iterable) {
      printer_->Print(" Iterable as _Iterable");
      if (import_modules.has_mapping) {
        printer_->Print(",");
      }
    }
    if (import_modules.has_mapping) {
      printer_->Print(" Mapping as _Mapping");
    }
    printer_->Print("\n");
  }
  printer_->Print("from typing import ");
  if (!opensource_runtime_ && file_->service_count() > 0) {
    printer_->Print("Any as _Any, ");
  }
  if (import_modules.has_callable) {
    printer_->Print("Callable as _Callable, ");
  }
  printer_->Print("ClassVar as _ClassVar");
  if (import_modules.has_optional) {
    printer_->Print(", Optional as _Optional");
  }
  if (import_modules.has_union) {
    printer_->Print(", Union as _Union");
  }
  printer_->Print("\n");

  // Public imports
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    const FileDescriptor* public_dep = file_->public_dependency(i);
    std::string module_name = StrippedModuleName(public_dep->name());
    // Top level messages in public imports
    for (int i = 0; i < public_dep->message_type_count(); ++i) {
      printer_->Print(
          "from $module$ import $message_class$ as $message_class$\n", "module",
          module_name, "message_class", public_dep->message_type(i)->name());
    }
    // Top level enums for public imports
    for (int i = 0; i < public_dep->enum_type_count(); ++i) {
      printer_->Print("from $module$ import $enum_class$ as $enum_class$\n",
                      "module", module_name, "enum_class",
                      public_dep->enum_type(i)->name());
    }
  }
  printer_->Print("\n");
}